

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_server.cc
# Opt level: O0

int __thiscall
raptor::TcpServer::GetPeerString(TcpServer *this,ConnectionId cid,char *buf,int buf_len)

{
  bool bVar1;
  element_type *this_00;
  undefined1 local_40 [8];
  shared_ptr<raptor::Connection> con;
  uint32_t index;
  int buf_len_local;
  char *buf_local;
  ConnectionId cid_local;
  TcpServer *this_local;
  
  con.super___shared_ptr<raptor::Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       buf_len;
  con.super___shared_ptr<raptor::Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
       CheckConnectionId(this,cid);
  if ((uint32_t)
      con.super___shared_ptr<raptor::Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
      0xffffffff) {
    this_local._4_4_ = -1;
  }
  else {
    GetConnection((TcpServer *)local_40,(uint32_t)this);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_40);
    if (bVar1) {
      this_00 = std::
                __shared_ptr_access<raptor::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<raptor::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_40);
      this_local._4_4_ =
           Connection::GetPeerString
                     (this_00,buf,
                      con.super___shared_ptr<raptor::Connection,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi._4_4_);
    }
    else {
      this_local._4_4_ = -1;
    }
    std::shared_ptr<raptor::Connection>::~shared_ptr((shared_ptr<raptor::Connection> *)local_40);
  }
  return this_local._4_4_;
}

Assistant:

int TcpServer::GetPeerString(ConnectionId cid, char* buf, int buf_len) {
    uint32_t index = CheckConnectionId(cid);
    if (index == InvalidIndex) {
        return -1;
    }

    auto con = GetConnection(index);
    if (con) {
        return con->GetPeerString(buf, buf_len);
    }
    return -1;
}